

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckListUsage(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  uint code;
  bool bVar2;
  uint local_1c;
  int msgcode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  local_1c = 0;
  BVar1 = Level2_Enabled(doc);
  if (BVar1 != no) {
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_OL)) {
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_UL)) {
        local_1c = 0x2bd;
      }
    }
    else {
      local_1c = 0x2be;
    }
    if (local_1c == 0) {
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_LI)) {
        if ((node->parent == (Node *)0x0) ||
           ((((node->parent == (Node *)0x0 || (node->parent->tag == (Dict *)0x0)) ||
             (node->parent->tag->id != TidyTag_OL)) &&
            (((node->parent == (Node *)0x0 || (node->parent->tag == (Dict *)0x0)) ||
             (node->parent->tag->id != TidyTag_UL)))))) {
          prvTidyReportAccessError(doc,node,0x2bf);
        }
        else if (((node->implicit != no) && (node->parent != (Node *)0x0)) &&
                (((node->parent != (Node *)0x0 &&
                  ((node->parent->tag != (Dict *)0x0 && (node->parent->tag->id == TidyTag_OL)))) ||
                 ((node->parent != (Node *)0x0 &&
                  ((node->parent->tag != (Dict *)0x0 && (node->parent->tag->id == TidyTag_UL))))))))
        {
          bVar2 = false;
          if ((node->parent != (Node *)0x0) && (bVar2 = false, node->parent->tag != (Dict *)0x0)) {
            bVar2 = node->parent->tag->id == TidyTag_UL;
          }
          code = 0x2be;
          if (bVar2) {
            code = 0x2bd;
          }
          prvTidyReportAccessError(doc,node,code);
        }
      }
    }
    else if (((node->content == (Node *)0x0) || (node->content->tag == (Dict *)0x0)) ||
            (node->content->tag->id != TidyTag_LI)) {
      prvTidyReportAccessError(doc,node,local_1c);
    }
    else if (node->implicit != no) {
      prvTidyReportAccessError(doc,node,0x2bf);
    }
  }
  return;
}

Assistant:

static void CheckListUsage( TidyDocImpl* doc, Node* node )
{
    int msgcode = 0;

    if (!Level2_Enabled( doc ))
        return;

    if ( nodeIsOL(node) )
        msgcode = LIST_USAGE_INVALID_OL;
    else if ( nodeIsUL(node) )
        msgcode = LIST_USAGE_INVALID_UL;

    if ( msgcode )
    {
       /*
       ** Check that OL/UL
       ** a) has LI child,
       ** b) was not added by Tidy parser
       ** IFF OL/UL node is implicit
       */
       if ( !nodeIsLI(node->content) ) {
            TY_(ReportAccessError)( doc, node, msgcode );
       } else if ( node->implicit ) {  /* if a tidy added node */
            TY_(ReportAccessError)( doc, node, LIST_USAGE_INVALID_LI );
       }
    }
    else if ( nodeIsLI(node) )
    {
        /* Check that LI parent 
        ** a) exists,
        ** b) is either OL or UL
        ** IFF the LI parent was added by Tidy
        ** ie, if it is marked 'implicit', then
        ** emit warnings LIST_USAGE_INVALID_UL or 
        ** warning LIST_USAGE_INVALID_OL tests 
        */
        if ( node->parent == NULL ||
             ( !nodeIsOL(node->parent) && !nodeIsUL(node->parent) ) )
        {
            TY_(ReportAccessError)( doc, node, LIST_USAGE_INVALID_LI );
        } else if ( node->implicit && node->parent &&
                    ( nodeIsOL(node->parent) || nodeIsUL(node->parent) ) ) {
            /* if tidy added LI node, then */
            msgcode = nodeIsUL(node->parent) ?
                LIST_USAGE_INVALID_UL : LIST_USAGE_INVALID_OL;
            TY_(ReportAccessError)( doc, node, msgcode );
        }
    }
}